

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_harvest.cc
# Opt level: O0

bool __thiscall
sptk::PitchExtractionByHarvest::Get
          (PitchExtractionByHarvest *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<double,_std::allocator<double>_> *epochs,Polarity *polarity)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  undefined4 uVar5;
  long in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  double *in_RDI;
  double dVar6;
  undefined1 auVar7 [16];
  int target_length;
  vector<double,_std::allocator<double>_> tmp_f0;
  vector<double,_std::allocator<double>_> time_axis;
  int tmp_length;
  double frame_period;
  HarvestOption option;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  allocator_type *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffee0;
  double *in_stack_ffffffffffffff18;
  HarvestOption *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  double *in_stack_ffffffffffffff30;
  vector<double,_std::allocator<double>_> local_a8 [3];
  int local_5c;
  double local_58;
  HarvestOption local_50;
  long local_20;
  vector<double,_std::allocator<double>_> *local_18;
  bool local_1;
  
  if ((((ulong)in_RDI[6] & 1) == 0) ||
     (local_20 = in_RDX, local_18 = in_RSI,
     bVar1 = std::vector<double,_std::allocator<double>_>::empty
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0), bVar1
     )) {
    local_1 = false;
  }
  else {
    if (local_20 != 0) {
      world::InitializeHarvestOption(&local_50);
      local_58 = ((double)*(int *)(in_RDI + 1) * 1000.0) / in_RDI[2];
      local_50.f0_floor = in_RDI[3];
      local_50.f0_ceil = in_RDI[4];
      local_50.allowed_range = in_RDI[5];
      dVar6 = in_RDI[2];
      local_50.frame_period = local_58;
      sVar3 = std::vector<double,_std::allocator<double>_>::size(local_18);
      local_5c = world::GetSamplesForHarvest((int)dVar6,(int)sVar3,local_58);
      std::allocator<double>::allocator((allocator<double> *)0x10ad73);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffee0,
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffed0);
      std::allocator<double>::~allocator((allocator<double> *)0x10ad99);
      _Var4._M_current = (double *)(long)local_5c;
      std::allocator<double>::allocator((allocator<double> *)0x10adb8);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffffee0,
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffed0);
      std::allocator<double>::~allocator((allocator<double> *)0x10adde);
      __first._M_current =
           std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x10adeb);
      sVar3 = std::vector<double,_std::allocator<double>_>::size(local_18);
      uVar5 = (undefined4)sVar3;
      iVar2 = (int)in_RDI[2];
      __last._M_current =
           std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x10ae1f);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x10ae31);
      world::Harvest(in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                     (int)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                     in_stack_ffffffffffffff18,in_RDI);
      sVar3 = std::vector<double,_std::allocator<double>_>::size(local_18);
      auVar7._8_4_ = (int)(sVar3 >> 0x20);
      auVar7._0_8_ = sVar3;
      auVar7._12_4_ = 0x45300000;
      dVar6 = ceil(((auVar7._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) /
                   (double)*(int *)(in_RDI + 1));
      if ((int)dVar6 < local_5c) {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)__last._M_current,
                   CONCAT44(iVar2,uVar5));
      }
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)__last._M_current,CONCAT44(iVar2,uVar5))
      ;
      this_01 = local_a8;
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffeb8);
      std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffeb8);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffeb8);
      __result._M_current._4_4_ = iVar2;
      __result._M_current._0_4_ = uVar5;
      _Var4 = std::
              copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                        (_Var4,__last,__result);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffeb8);
      this_00 = local_a8;
      std::vector<double,_std::allocator<double>_>::size(this_00);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                _Var4._M_current,(difference_type)this_01);
      std::vector<double,_std::allocator<double>_>::end(this_00);
      std::vector<double,_std::allocator<double>_>::back(this_01);
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (__first,_Var4,(double *)this_01);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)__first._M_current);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)__first._M_current);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool PitchExtractionByHarvest::Get(
    const std::vector<double>& waveform, std::vector<double>* f0,
    std::vector<double>* epochs,
    PitchExtractionInterface::Polarity* polarity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty()) {
    return false;
  }

  if (NULL != f0) {
    world::HarvestOption option;
    world::InitializeHarvestOption(&option);

    const double frame_period((1000.0 * frame_shift_) / sampling_rate_);
    option.frame_period = frame_period;
    option.f0_floor = lower_f0_;
    option.f0_ceil = upper_f0_;
    option.allowed_range = voicing_threshold_;

    const int tmp_length(world::GetSamplesForHarvest(
        static_cast<int>(sampling_rate_), static_cast<int>(waveform.size()),
        frame_period));
    std::vector<double> time_axis(tmp_length);
    std::vector<double> tmp_f0(tmp_length);
    world::Harvest(waveform.data(), static_cast<int>(waveform.size()),
                   static_cast<int>(sampling_rate_), &option, time_axis.data(),
                   tmp_f0.data());

    const int target_length(static_cast<int>(
        std::ceil(static_cast<double>(waveform.size()) / frame_shift_)));
    if (target_length < tmp_length) {
      tmp_f0.resize(target_length);
    }
    f0->resize(target_length);
    std::copy(tmp_f0.begin(), tmp_f0.end(), f0->begin());
    std::fill(f0->begin() + tmp_f0.size(), f0->end(), tmp_f0.back());
  }

  if (NULL != epochs) {
    // nothing to do
  }

  if (NULL != polarity) {
    // nothing to do
  }

  return true;
}